

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mavlink_helpers.h
# Opt level: O0

uint8_t mavlink_sign_packet(mavlink_signing_t *signing,uint8_t *signature,uint8_t *header,
                           uint8_t header_len,uint8_t *packet,uint8_t packet_len,uint8_t *crc)

{
  uint64_t uVar1;
  undefined4 local_b0;
  undefined2 uStack_ac;
  anon_union_8_2_c960a391 tstamp;
  mavlink_sha256_ctx ctx;
  uint8_t packet_len_local;
  uint8_t *packet_local;
  uint8_t header_len_local;
  uint8_t *header_local;
  uint8_t *signature_local;
  mavlink_signing_t *signing_local;
  
  if ((signing == (mavlink_signing_t *)0x0) || ((signing->flags & 1) == 0)) {
    signing_local._7_1_ = '\0';
  }
  else {
    *signature = signing->link_id;
    uVar1 = signing->timestamp;
    local_b0 = (undefined4)uVar1;
    *(undefined4 *)(signature + 1) = local_b0;
    uStack_ac = (undefined2)(uVar1 >> 0x20);
    *(undefined2 *)(signature + 5) = uStack_ac;
    signing->timestamp = signing->timestamp + 1;
    ctx.u.save_bytes[0x3b] = packet_len;
    unique0x10000148 = packet;
    mavlink_sha256_init((mavlink_sha256_ctx *)(tstamp.t8 + 4));
    mavlink_sha256_update((mavlink_sha256_ctx *)(tstamp.t8 + 4),signing->secret_key,0x20);
    mavlink_sha256_update((mavlink_sha256_ctx *)(tstamp.t8 + 4),header,(uint)header_len);
    mavlink_sha256_update
              ((mavlink_sha256_ctx *)(tstamp.t8 + 4),stack0xffffffffffffffc8,
               (uint)ctx.u.save_bytes[0x3b]);
    mavlink_sha256_update((mavlink_sha256_ctx *)(tstamp.t8 + 4),crc,2);
    mavlink_sha256_update((mavlink_sha256_ctx *)(tstamp.t8 + 4),signature,7);
    mavlink_sha256_final_48((mavlink_sha256_ctx *)(tstamp.t8 + 4),signature + 7);
    signing_local._7_1_ = '\r';
  }
  return signing_local._7_1_;
}

Assistant:

MAVLINK_HELPER uint8_t mavlink_sign_packet(mavlink_signing_t *signing,
					   uint8_t signature[MAVLINK_SIGNATURE_BLOCK_LEN],
					   const uint8_t *header, uint8_t header_len,
					   const uint8_t *packet, uint8_t packet_len,
					   const uint8_t crc[2])
{
	mavlink_sha256_ctx ctx;
	union {
	    uint64_t t64;
	    uint8_t t8[8];
	} tstamp;
	if (signing == NULL || !(signing->flags & MAVLINK_SIGNING_FLAG_SIGN_OUTGOING)) {
	    return 0;
	}
	signature[0] = signing->link_id;
	tstamp.t64 = signing->timestamp;
	memcpy(&signature[1], tstamp.t8, 6);
	signing->timestamp++;
	
	mavlink_sha256_init(&ctx);
	mavlink_sha256_update(&ctx, signing->secret_key, sizeof(signing->secret_key));
	mavlink_sha256_update(&ctx, header, header_len);
	mavlink_sha256_update(&ctx, packet, packet_len);
	mavlink_sha256_update(&ctx, crc, 2);
	mavlink_sha256_update(&ctx, signature, 7);
	mavlink_sha256_final_48(&ctx, &signature[7]);
	
	return MAVLINK_SIGNATURE_BLOCK_LEN;
}